

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int StrReplaceWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)

{
  char *pSrc;
  char *pDest;
  int nByte;
  SyString sWorker;
  
  pSrc = jx9_value_to_string(pData,&nByte);
  sWorker.zString = (char *)0x0;
  sWorker.nByte = 0;
  if (0 < nByte) {
    pDest = (char *)jx9_context_alloc_chunk(*(jx9_context **)((long)pUserData + 0x18),nByte,0,1);
    if (pDest == (char *)0x0) {
      jx9_context_throw_error
                (*(jx9_context **)((long)pUserData + 0x18),1,"JX9 is running out of memory");
      return 0;
    }
    SyMemcpy(pSrc,pDest,nByte);
    sWorker.nByte = nByte;
    sWorker.zString = pDest;
  }
  SySetPut(*(SySet **)((long)pUserData + 0x10),&sWorker);
  return 0;
}

Assistant:

static int StrReplaceWalker(jx9_value *pKey, jx9_value *pData, void *pUserData)
{
	str_replace_data *pRep = (str_replace_data *)pUserData;
	SyString sWorker;
	const char *zIn;
	int nByte;
	/* Extract a string representation of the given argument */
	zIn = jx9_value_to_string(pData, &nByte);
	SyStringInitFromBuf(&sWorker, 0, 0);
	if( nByte > 0 ){
		char *zDup;
		/* Duplicate the chunk */
		zDup = (char *)jx9_context_alloc_chunk(pRep->pCtx, (unsigned int)nByte, FALSE, 
			TRUE /* Release the chunk automatically, upon this context is destroyd */
			);
		if( zDup == 0 ){
			/* Ignore any memory failure problem */
			jx9_context_throw_error(pRep->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			return JX9_OK;
		}
		SyMemcpy(zIn, zDup, (sxu32)nByte);
		/* Save the chunk */
		SyStringInitFromBuf(&sWorker, zDup, nByte);
	}
	/* Save for later processing */
	SySetPut(pRep->pCollector, (const void *)&sWorker);
	/* All done */
	SXUNUSED(pKey); /* cc warning */
	return JX9_OK;
}